

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall
cmCacheManager::CacheIterator::AppendProperty(CacheIterator *this,string *p,char *v,bool asString)

{
  _Base_ptr p_Var1;
  
  p_Var1 = (this->Position)._M_node;
  if ((_Rb_tree_header *)p_Var1 != &(this->Container->Cache)._M_t._M_impl.super__Rb_tree_header) {
    CacheEntry::AppendProperty((CacheEntry *)(p_Var1 + 2),p,v,asString);
    return;
  }
  return;
}

Assistant:

bool cmCacheManager::CacheIterator::IsAtEnd() const
{
  return this->Position == this->Container.Cache.end();
}